

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::toString<float>(String *__return_storage_ptr__,IsNaN<float> in)

{
  char *__dest;
  char *pcVar1;
  ulong __n;
  anon_union_24_2_13149d16_for_String_3 local_b0;
  anon_union_24_2_13149d16_for_String_3 local_98;
  anon_union_24_2_13149d16_for_String_3 local_80;
  anon_union_24_2_13149d16_for_String_3 local_68;
  anon_union_24_2_13149d16_for_String_3 local_50;
  anon_union_24_2_13149d16_for_String_3 local_38;
  
  pcVar1 = "! ";
  if (((ulong)in & 0x100000000) == 0) {
    pcVar1 = "";
  }
  __n = ((ulong)in & 0x100000000) >> 0x1f;
  __dest = String::allocate((String *)&local_68.data,(size_type)__n);
  memcpy(__dest,pcVar1,__n);
  pcVar1 = String::allocate((String *)&local_80.data,7);
  builtin_strncpy(pcVar1,"IsNaN( ",7);
  operator+((String *)&local_50.data,(String *)&local_68.data,(String *)&local_80.data);
  detail::tlssPush();
  std::ostream::_M_insert<double>((double)in.value);
  detail::tlssPop();
  operator+((String *)&local_38.data,(String *)&local_50.data,(String *)&local_98.data);
  pcVar1 = String::allocate((String *)&local_b0.data,2);
  pcVar1[0] = ' ';
  pcVar1[1] = ')';
  operator+(__return_storage_ptr__,(String *)&local_38.data,(String *)&local_b0.data);
  if ((local_b0.buf[0x17] < '\0') && (local_b0.data.ptr != (char *)0x0)) {
    operator_delete__(local_b0.data.ptr);
  }
  if ((local_38.buf[0x17] < '\0') && (local_38.data.ptr != (char *)0x0)) {
    operator_delete__(local_38.data.ptr);
  }
  if ((local_98.buf[0x17] < '\0') && (local_98.data.ptr != (char *)0x0)) {
    operator_delete__(local_98.data.ptr);
  }
  if ((local_50.buf[0x17] < '\0') && (local_50.data.ptr != (char *)0x0)) {
    operator_delete__(local_50.data.ptr);
  }
  if ((local_80.buf[0x17] < '\0') && (local_80.data.ptr != (char *)0x0)) {
    operator_delete__(local_80.data.ptr);
  }
  if ((local_68.buf[0x17] < '\0') && (local_68.data.ptr != (char *)0x0)) {
    operator_delete__(local_68.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String toString(IsNaN<F> in) { return String(in.flipped ? "! " : "") + "IsNaN( " + doctest::toString(in.value) + " )"; }